

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O3

void * obuf_alloc_pos(obuf *buf,size_t size)

{
  int iVar1;
  size_t sVar2;
  ulong size_00;
  slab *psVar3;
  slab *psVar4;
  bool bVar5;
  
  iVar1 = buf->pos;
  if ((buf->capacity[iVar1] != 0) || (buf->iov[iVar1].iov_len != 0)) {
    __assert_fail("buf->capacity[pos] == 0 && buf->iov[pos].iov_len == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                  ,0x29,"void *obuf_alloc_pos(struct obuf *, size_t)");
  }
  if (0x1e < iVar1) {
    __assert_fail("pos < SMALL_OBUF_IOV_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                  ,0x2a,"void *obuf_alloc_pos(struct obuf *, size_t)");
  }
  if (buf->n_iov != iVar1) {
    __assert_fail("buf->n_iov == pos",
                  "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                  ,0x2b,"void *obuf_alloc_pos(struct obuf *, size_t)");
  }
  sVar2 = buf->iov[iVar1].iov_len;
  buf->iov[(long)iVar1 + 1].iov_base = buf->iov[iVar1].iov_base;
  buf->iov[(long)iVar1 + 1].iov_len = sVar2;
  buf->capacity[(long)iVar1 + 1] = buf->capacity[iVar1];
  size_00 = buf->start_capacity << ((byte)iVar1 & 0x3f);
  while (size_00 < size) {
    bVar5 = size_00 == 0;
    size_00 = size_00 * 2;
    if (bVar5) {
      size_00 = buf->start_capacity;
    }
  }
  psVar3 = slab_get(buf->slabc,size_00);
  if (psVar3 == (slab *)0x0) {
    psVar4 = (slab *)0x0;
  }
  else {
    psVar4 = psVar3 + 1;
    buf->iov[iVar1].iov_base = psVar4;
    buf->capacity[iVar1] = psVar3->size - 0x30;
    buf->n_iov = buf->n_iov + 1;
  }
  return psVar4;
}

Assistant:

static inline void *
obuf_alloc_pos(struct obuf *buf, size_t size)
{
	int pos = buf->pos;
	assert(buf->capacity[pos] == 0 && buf->iov[pos].iov_len == 0);
	assert(pos < SMALL_OBUF_IOV_MAX);
	assert(buf->n_iov == pos);
	/** Initialize the next pos. */
	buf->iov[pos+1] = buf->iov[pos];
	buf->capacity[pos+1] = buf->capacity[pos];
	size_t capacity = buf->start_capacity << pos;
	while (capacity < size) {
		capacity = capacity == 0 ? buf->start_capacity: capacity * 2;
	}
	struct slab *slab = slab_get(buf->slabc, capacity);
	if (slab == NULL)
		return NULL;
	buf->iov[pos].iov_base = slab_data(slab);
	buf->capacity[pos] = slab_capacity(slab);
	buf->n_iov++;
	return buf->iov[pos].iov_base;
}